

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O3

TranslationBlock * tcg_tb_alloc_mips(TCGContext_conflict3 *s)

{
  size_t sVar1;
  _Bool _Var2;
  TranslationBlock *pTVar3;
  long lVar4;
  void *pvVar5;
  ulong uVar6;
  
  lVar4 = (long)s->uc->qemu_icache_linesize;
  uVar6 = -lVar4;
  pTVar3 = (TranslationBlock *)((long)s->code_gen_ptr + lVar4 + -1 & uVar6);
  pvVar5 = (void *)((long)pTVar3->jmp_dest + lVar4 + 0xf & uVar6);
  if (s->code_gen_highwater < pvVar5) {
    do {
      sVar1 = s->code_gen_buffer_size;
      _Var2 = tcg_region_alloc__locked(s);
      if (_Var2) {
        return (TranslationBlock *)0x0;
      }
      (s->region).agg_size_full = ((s->region).agg_size_full + sVar1) - 0x400;
      pTVar3 = (TranslationBlock *)((long)s->code_gen_ptr + lVar4 + -1 & uVar6);
      pvVar5 = (void *)((long)pTVar3->jmp_dest + lVar4 + 0xf & uVar6);
    } while (s->code_gen_highwater < pvVar5);
  }
  s->code_gen_ptr = pvVar5;
  s->data_gen_ptr = (void *)0x0;
  return pTVar3;
}

Assistant:

TranslationBlock *tcg_tb_alloc(TCGContext *s)
{
    uintptr_t align = s->uc->qemu_icache_linesize;
    TranslationBlock *tb;
    void *next;

 retry:
    tb = (void *)ROUND_UP((uintptr_t)s->code_gen_ptr, align);
    next = (void *)ROUND_UP((uintptr_t)(tb + 1), align);

    if (unlikely(next > s->code_gen_highwater)) {
        if (tcg_region_alloc(s)) {
            return NULL;
        }
        goto retry;
    }
    s->code_gen_ptr = next;
    s->data_gen_ptr = NULL;
    return tb;
}